

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esni.c
# Opt level: O3

int main(int argc,char **argv)

{
  ushort uVar1;
  char *__s2;
  st_x9_62_keyex_context_t *ctx;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  int extraout_EAX;
  uint uVar5;
  int iVar6;
  FILE *fp;
  EVP_PKEY *pEVar7;
  ptls_cipher_suite_t *ppVar8;
  ulong uVar9;
  long lVar10;
  st_x9_62_keyex_context_t *extraout_RAX;
  ec_key_st *key;
  EC_GROUP *group;
  uchar *buf;
  ptls_key_exchange_context_t **pppVar11;
  ptls_key_exchange_algorithm_t *algo;
  ptls_cipher_suite_t **pppVar12;
  uint16_t padded_length;
  uint64_t _v;
  uint64_t lifetime;
  anon_struct_2056_2_5014a043 key_exchanges;
  st_x9_62_keyex_context_t *psStack_1108;
  char **ppcStack_1100;
  ushort *puStack_10f8;
  undefined *puStack_10f0;
  code *pcStack_10e8;
  undefined8 uStack_10e0;
  ushort local_10d0;
  undefined1 local_10ce;
  undefined1 local_10cd;
  ushort local_10cc;
  ushort local_10ca;
  ulong local_10c8;
  ptls_buffer_t local_10c0;
  long local_10a0;
  ptls_cipher_suite_t **local_1098;
  undefined2 local_108a;
  long local_1088;
  undefined4 local_107c;
  ulong local_1078;
  ulong local_1070;
  undefined4 local_1068 [10];
  ptls_key_exchange_context_t *local_1040 [256];
  long local_840;
  ptls_cipher_suite_t *local_838 [257];
  
  uStack_10e0 = 0x105b7e;
  OPENSSL_init_crypto(2);
  uStack_10e0 = 0x105b8a;
  OPENSSL_init_crypto(0xc);
  uStack_10e0 = 0x105b8f;
  ENGINE_load_builtin_engines();
  uStack_10e0 = 0x105b94;
  ENGINE_register_all_ciphers();
  uStack_10e0 = 0x105b99;
  ENGINE_register_all_digests();
  uStack_10e0 = 0x105bad;
  memset(local_1040,0,0x808);
  uStack_10e0 = 0x105bc1;
  memset(local_838,0,0x808);
  local_10d0 = 0x104;
  local_10a0 = 0x76a700;
  local_1098 = ptls_openssl_cipher_suites + 1;
  local_10c8 = 0;
LAB_00105bff:
  while( true ) {
    uStack_10e0 = 0x105c0c;
    pEVar7 = (EVP_PKEY *)argv;
    buf = (uchar *)(ulong)(uint)argc;
    iVar4 = getopt(argc,argv,"K:c:d:p:h");
    __s2 = _optarg;
    if (iVar4 < 100) break;
    if (iVar4 == 100) {
      uStack_10e0 = 0x105cec;
      iVar4 = __isoc99_sscanf(_optarg,"%lu",&local_10a0);
      if ((iVar4 != 1) || (local_10a0 == 0)) {
LAB_00106118:
        uStack_10e0 = 0x10611d;
        main_cold_2();
LAB_0010611d:
        uStack_10e0 = 0x106122;
        main_cold_4();
LAB_00106122:
        uStack_10e0 = 0x106127;
        main_cold_6();
        goto LAB_00106127;
      }
      local_10a0 = local_10a0 * 0x15180;
    }
    else {
      if (iVar4 != 0x70) {
        if (iVar4 == 0x68) {
          uStack_10e0 = 0x106109;
          printf("picotls-esni - generates an ESNI Resource Record\n\nUsage: %s [options]\nOptions:\n  -K <key-file>       private key files (repeat the option to include multiple\n                      keys)\n  -c <cipher-suite>   aes128-gcm, chacha20-poly1305, ...\n  -d <days>           number of days until expiration (default: 90)\n  -p <padded-length>  padded length (default: 260)\n  -h                  prints this help\n\n-c and -x can be used multiple times.\n\n"
                 ,*argv);
          uStack_10e0 = 0x106110;
          exit(0);
        }
        goto LAB_00106131;
      }
      uStack_10e0 = 0x105c37;
      iVar4 = __isoc99_sscanf(_optarg,"%hu",&local_10d0);
      if ((iVar4 != 1) || (local_10d0 == 0)) goto LAB_0010612c;
    }
  }
  if (iVar4 != 0x4b) {
    if (iVar4 == -1) {
      if (local_10c8 == 0) {
        local_838[0] = &ptls_openssl_aes128gcmsha256;
      }
      if (local_840 == 0) {
        uStack_10e0 = 0x106151;
        main_cold_7();
        pcStack_10e8 = (code *)0x10615a;
        uStack_10e0._0_4_ = extraout_EAX;
        uVar5 = RAND_bytes(buf,(int)pEVar7);
        if (uVar5 == 1) {
          return (int)uStack_10e0;
        }
        pppVar11 = (ptls_key_exchange_context_t **)(ulong)uVar5;
        pcStack_10e8 = ptls_openssl_create_key_exchange;
        ptls_openssl_random_bytes_cold_1();
        puStack_10f0 = &optarg;
        psStack_1108 = extraout_RAX;
        ppcStack_1100 = argv;
        puStack_10f8 = &local_10d0;
        pcStack_10e8 = (code *)(ulong)(uint)argc;
        iVar4 = EVP_PKEY_get_id(pEVar7);
        if (iVar4 == 0x40a) {
          iVar4 = evp_keyex_init(&ptls_openssl_x25519,pppVar11,(EVP_PKEY *)pEVar7);
          if (iVar4 == 0) {
            EVP_PKEY_up_ref(pEVar7);
            return 0;
          }
          return iVar4;
        }
        iVar6 = 0x204;
        if (iVar4 != 0x198) {
          return 0x204;
        }
        key = EVP_PKEY_get1_EC_KEY(pEVar7);
        group = EC_KEY_get0_group(key);
        iVar4 = EC_GROUP_get_curve_name(group);
        if (iVar4 == 0x19f) {
          algo = &ptls_openssl_secp256r1;
        }
        else if (iVar4 == 0x2cc) {
          algo = &ptls_openssl_secp521r1;
        }
        else {
          if (iVar4 != 0x2cb) goto LAB_00106242;
          algo = &ptls_openssl_secp384r1;
        }
        psStack_1108 = (st_x9_62_keyex_context_t *)0x0;
        iVar6 = x9_62_create_context(algo,&psStack_1108);
        ctx = psStack_1108;
        if (iVar6 == 0) {
          psStack_1108->privkey = (EC_KEY *)key;
          iVar6 = x9_62_setup_pubkey(psStack_1108);
          if (iVar6 == 0) {
            *pppVar11 = &ctx->super;
            return 0;
          }
LAB_00106233:
          x9_62_free_context(ctx);
        }
        else if (psStack_1108 != (st_x9_62_keyex_context_t *)0x0) goto LAB_00106233;
        *pppVar11 = (ptls_key_exchange_context_t *)0x0;
LAB_00106242:
        EC_KEY_free(key);
        return iVar6;
      }
      local_1098 = (ptls_cipher_suite_t **)CONCAT44(local_1098._4_4_,(uint)local_10d0);
      uStack_10e0 = 0x105dbd;
      local_10c8 = time((time_t *)0x0);
      local_1088 = local_10a0;
      local_10c0.base = "";
      local_10c0.capacity = 0;
      local_10c0.off = 0;
      local_10c0.is_allocated = 0;
      local_108a = 0x1ff;
      uStack_10e0 = 0x105dfd;
      iVar4 = ptls_buffer__do_pushv(&local_10c0,&local_108a,2);
      if (iVar4 != 0) goto LAB_001060c7;
      local_107c = 0;
      uStack_10e0 = 0x105e1f;
      iVar4 = ptls_buffer__do_pushv(&local_10c0,&local_107c,4);
      if (iVar4 != 0) goto LAB_001060c7;
      uStack_10e0 = 0x105e3d;
      iVar4 = ptls_buffer__do_pushv(&local_10c0,"",2);
      sVar2 = local_10c0.off;
      if (iVar4 != 0) goto LAB_001060c7;
      if (local_1040[0] == (ptls_key_exchange_context_t *)0x0) goto LAB_00105f07;
      pppVar11 = local_1040;
      goto LAB_00105e77;
    }
    ppVar8 = ptls_openssl_cipher_suites[0];
    pppVar12 = local_1098;
    if (iVar4 != 99) goto LAB_00106131;
    while( true ) {
      if (ppVar8 == (ptls_cipher_suite_t *)0x0) {
        uStack_10e0 = 0x106118;
        main_cold_3();
        goto LAB_00106118;
      }
      uStack_10e0 = 0x105d4c;
      iVar4 = strcasecmp(ppVar8->aead->name,__s2);
      if (iVar4 == 0) break;
      ppVar8 = *pppVar12;
      pppVar12 = pppVar12 + 1;
    }
    local_838[local_10c8] = ppVar8;
    local_10c8 = local_10c8 + 1;
    goto LAB_00105bff;
  }
  uStack_10e0 = 0x105c65;
  fp = fopen(_optarg,"rt");
  if (fp == (FILE *)0x0) goto LAB_00106122;
  uStack_10e0 = 0x105c7f;
  pEVar7 = PEM_read_PrivateKey(fp,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
  if (pEVar7 != (EVP_PKEY *)0x0) {
    uStack_10e0 = 0x105c93;
    fclose(fp);
    pppVar11 = local_1040 + local_840;
    uStack_10e0 = 0x105cba;
    local_840 = local_840 + 1;
    iVar4 = ptls_openssl_create_key_exchange(pppVar11,(EVP_PKEY *)pEVar7);
    if (iVar4 != 0) goto LAB_0010611d;
    uStack_10e0 = 0x105cca;
    EVP_PKEY_free(pEVar7);
    goto LAB_00105bff;
  }
LAB_00106127:
  uStack_10e0 = 0x10612c;
  main_cold_5();
LAB_0010612c:
  uStack_10e0 = 0x106131;
  main_cold_1();
LAB_00106131:
  uStack_10e0 = 0x106142;
  printf("picotls-esni - generates an ESNI Resource Record\n\nUsage: %s [options]\nOptions:\n  -K <key-file>       private key files (repeat the option to include multiple\n                      keys)\n  -c <cipher-suite>   aes128-gcm, chacha20-poly1305, ...\n  -d <days>           number of days until expiration (default: 90)\n  -p <padded-length>  padded length (default: 260)\n  -h                  prints this help\n\n-c and -x can be used multiple times.\n\n"
         ,*argv);
  goto LAB_00106142;
  while( true ) {
    uStack_10e0 = 0x105eae;
    iVar4 = ptls_buffer__do_pushv(&local_10c0,"",2);
    sVar3 = local_10c0.off;
    if (iVar4 != 0) goto LAB_001060c7;
    uStack_10e0 = 0x105ecf;
    iVar4 = ptls_buffer__do_pushv
                      (&local_10c0,(pppVar11[-1]->pubkey).base,(pppVar11[-1]->pubkey).len);
    if (iVar4 != 0) goto LAB_001060c7;
    local_10c0.base[sVar3 - 2] = (uint8_t)(local_10c0.off - sVar3 >> 8);
    local_10c0.base[sVar3 - 1] = (uint8_t)(local_10c0.off - sVar3);
    local_1040[0] = *pppVar11;
    if (local_1040[0] == (ptls_key_exchange_context_t *)0x0) break;
LAB_00105e77:
    pppVar11 = pppVar11 + 1;
    uVar1 = local_1040[0]->algo->id;
    local_10ca = uVar1 << 8 | uVar1 >> 8;
    uStack_10e0 = 0x105e96;
    iVar4 = ptls_buffer__do_pushv(&local_10c0,&local_10ca,2);
    if (iVar4 != 0) goto LAB_001060c7;
  }
LAB_00105f07:
  local_10c0.base[sVar2 - 2] = (uint8_t)(local_10c0.off - sVar2 >> 8);
  local_10c0.base[sVar2 - 1] = (uint8_t)(local_10c0.off - sVar2);
  uStack_10e0 = 0x105f2e;
  iVar4 = ptls_buffer__do_pushv(&local_10c0,"",2);
  sVar2 = local_10c0.off;
  if (iVar4 == 0) {
    if (local_838[0] != (ptls_cipher_suite_t *)0x0) {
      pppVar12 = local_838;
      ppVar8 = local_838[0];
      do {
        pppVar12 = pppVar12 + 1;
        local_10cc = ppVar8->id << 8 | ppVar8->id >> 8;
        uStack_10e0 = 0x105f79;
        iVar4 = ptls_buffer__do_pushv(&local_10c0,&local_10cc,2);
        if (iVar4 != 0) goto LAB_001060c7;
        ppVar8 = *pppVar12;
      } while (ppVar8 != (ptls_cipher_suite_t *)0x0);
    }
    local_10c0.base[sVar2 - 2] = (uint8_t)(local_10c0.off - sVar2 >> 8);
    local_10c0.base[sVar2 - 1] = (uint8_t)(local_10c0.off - sVar2);
    local_10ce = (undefined1)((ulong)local_1098 >> 8);
    local_10cd = SUB81(local_1098,0);
    uStack_10e0 = 0x105fc3;
    iVar4 = ptls_buffer__do_pushv(&local_10c0,&local_10ce,2);
    if (iVar4 == 0) {
      local_1070 = local_10c8 >> 0x38 | (local_10c8 & 0xff000000000000) >> 0x28 |
                   (local_10c8 & 0xff0000000000) >> 0x18 | (local_10c8 & 0xff00000000) >> 8 |
                   (local_10c8 & 0xff000000) << 8 | (local_10c8 & 0xff0000) << 0x18 |
                   (local_10c8 & 0xff00) << 0x28 | local_10c8 << 0x38;
      uStack_10e0 = 0x105fea;
      iVar4 = ptls_buffer__do_pushv(&local_10c0,&local_1070,8);
      if (iVar4 == 0) {
        uVar9 = (local_10c8 + local_1088) - 1;
        local_1078 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                     (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                     (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                     (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
        uStack_10e0 = 0x10601c;
        iVar4 = ptls_buffer__do_pushv(&local_10c0,&local_1078,8);
        if (iVar4 == 0) {
          uStack_10e0 = 0x10603a;
          iVar4 = ptls_buffer__do_pushv(&local_10c0,"",2);
          if (iVar4 == 0) {
            lVar10 = -2;
            do {
              local_10c0.base[lVar10 + local_10c0.off] = '\0';
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0);
            uStack_10e0 = 0x10607f;
            ptls_calc_hash(&ptls_openssl_sha256,local_1068,local_10c0.base,local_10c0.off);
            *(undefined4 *)(local_10c0.base + 2) = local_1068[0];
            uStack_10e0 = 0x1060a3;
            fwrite(local_10c0.base,1,local_10c0.off,_stdout);
            uStack_10e0 = 0x1060ab;
            fflush(_stdout);
            uStack_10e0 = 0x1060b3;
            ptls_buffer__release_memory(&local_10c0);
            return 0;
          }
        }
      }
    }
  }
LAB_001060c7:
  uStack_10e0 = 0x1060d1;
  ptls_buffer__release_memory(&local_10c0);
  uStack_10e0 = 0x1060f1;
  fwrite("failed to generate ESNI private structure.\n",0x2b,1,_stderr);
LAB_00106142:
  uStack_10e0 = 0x10614c;
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    struct {
        ptls_key_exchange_context_t *elements[256];
        size_t count;
    } key_exchanges = {{NULL}, 0};
    struct {
        ptls_cipher_suite_t *elements[256];
        size_t count;
    } cipher_suites = {{NULL}, 0};
    uint16_t padded_length = 260;
    uint64_t lifetime = 90 * 86400;

    int ch;
    while ((ch = getopt(argc, argv, "K:c:d:p:h")) != -1) {
        switch (ch) {
        case 'K': {
            FILE *fp;
            EVP_PKEY *pkey;
            if ((fp = fopen(optarg, "rt")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            if ((pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL)) == NULL) {
                fprintf(stderr, "failed to read private key from file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            fclose(fp);
            if (ptls_openssl_create_key_exchange(key_exchanges.elements + key_exchanges.count++, pkey) != 0) {
                fprintf(stderr, "unknown type of private key found in file:%s\n", optarg);
                exit(1);
            }
            EVP_PKEY_free(pkey);
        } break;
        case 'c': {
            size_t i;
            for (i = 0; ptls_openssl_cipher_suites[i] != NULL; ++i)
                if (strcasecmp(ptls_openssl_cipher_suites[i]->aead->name, optarg) == 0)
                    break;
            if (ptls_openssl_cipher_suites[i] == NULL) {
                fprintf(stderr, "unknown cipher-suite: %s\n", optarg);
                exit(1);
            }
            cipher_suites.elements[cipher_suites.count++] = ptls_openssl_cipher_suites[i];
        } break;
        case 'd':
            if (sscanf(optarg, "%" SCNu64, &lifetime) != 1 || lifetime == 0) {
                fprintf(stderr, "lifetime must be a positive integer\n");
                exit(1);
            }
            lifetime *= 86400; /* convert to seconds */
            break;
        case 'p':
            if (sscanf(optarg, "%" SCNu16, &padded_length) != 1 || padded_length == 0) {
                fprintf(stderr, "padded length must be a positive integer\n");
                exit(1);
            }
            break;
        case 'h':
            usage(argv[0], 0);
            break;
        default:
            usage(argv[0], 1);
            break;
        }
    }
    if (cipher_suites.count == 0)
        cipher_suites.elements[cipher_suites.count++] = &ptls_openssl_aes128gcmsha256;
    if (key_exchanges.count == 0) {
        fprintf(stderr, "no private key specified\n");
        exit(1);
    }

    argc -= optind;
    argv += optind;

    if (emit_esni(key_exchanges.elements, cipher_suites.elements, padded_length, time(NULL), lifetime) != 0) {
        fprintf(stderr, "failed to generate ESNI private structure.\n");
        exit(1);
    }

    return 0;
}